

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::ConvertSpecialStringToDouble(string *input,double *output)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  bool bVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  double *in_RSI;
  string *in_RDI;
  double dVar10;
  double tmp_2;
  double tmp_1;
  double tmp;
  string lowercase_input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  undefined1 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffef9;
  undefined1 in_stack_fffffffffffffefa;
  string local_f0 [32];
  double local_d0;
  string local_c8 [32];
  double local_a8;
  string local_a0 [32];
  double local_80;
  undefined4 local_74;
  char *local_70;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  string local_38 [32];
  double *local_18;
  string *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar8 = std::__cxx11::string::empty();
  if (((uVar8 & 1) != 0) || (local_18 == (double *)0x0)) {
    local_1 = 0;
    goto LAB_00106f20;
  }
  std::__cxx11::string::string(local_38,local_10);
  local_40 = std::__cxx11::string::begin();
  local_48 = std::__cxx11::string::end();
  local_50 = std::__cxx11::string::begin();
  local_70 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,sptk::ConvertSpecialStringToDouble(std::__cxx11::string_const&,double*)::__0>
                               (local_40,local_48,local_50);
  uVar1 = std::operator==((char *)CONCAT17(in_stack_fffffffffffffef7,
                                           CONCAT16(in_stack_fffffffffffffef6,
                                                    in_stack_fffffffffffffef0)),
                          in_stack_fffffffffffffee8);
  if ((bool)uVar1) {
    *local_18 = 3.141592653589793;
    local_1 = 1;
  }
  else {
    uVar2 = std::operator==((char *)CONCAT17(in_stack_fffffffffffffef7,
                                             CONCAT16(in_stack_fffffffffffffef6,
                                                      in_stack_fffffffffffffef0)),
                            in_stack_fffffffffffffee8);
    if ((bool)uVar2) {
      *local_18 = 8.685889638065035;
      local_1 = 1;
    }
    else {
      uVar3 = std::operator==((char *)CONCAT17(in_stack_fffffffffffffef7,
                                               CONCAT16(in_stack_fffffffffffffef6,
                                                        in_stack_fffffffffffffef0)),
                              in_stack_fffffffffffffee8);
      if ((bool)uVar3) {
        *local_18 = 1731.2340490667555;
        local_1 = 1;
      }
      else {
        uVar4 = std::operator==((char *)CONCAT17(in_stack_fffffffffffffef7,
                                                 CONCAT16(in_stack_fffffffffffffef6,
                                                          in_stack_fffffffffffffef0)),
                                in_stack_fffffffffffffee8);
        if ((bool)uVar4) {
          *local_18 = 17.312340490667555;
          local_1 = 1;
        }
        else {
          uVar5 = std::operator==((char *)CONCAT17(in_stack_fffffffffffffef7,
                                                   CONCAT16(in_stack_fffffffffffffef6,
                                                            in_stack_fffffffffffffef0)),
                                  in_stack_fffffffffffffee8);
          if ((bool)uVar5) {
            *local_18 = 1.442695040888963;
            local_1 = 1;
          }
          else {
            lVar9 = std::__cxx11::string::find((char *)local_38,0x11c516);
            if (lVar9 == 0) {
              std::__cxx11::string::substr((ulong)local_a0,(ulong)local_38);
              bVar6 = ConvertStringToDouble
                                ((string *)
                                 CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffefa,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffef9,
                                                  in_stack_fffffffffffffef8))))))),
                                 (double *)
                                 CONCAT17(in_stack_fffffffffffffef7,
                                          CONCAT16(in_stack_fffffffffffffef6,
                                                   in_stack_fffffffffffffef0)));
              bVar7 = bVar6 && 0.0 <= local_80;
              std::__cxx11::string::~string(local_a0);
              if ((bVar7 & 1) != 0) {
                dVar10 = sqrt(local_80);
                *local_18 = dVar10;
                local_1 = 1;
                goto LAB_00106f13;
              }
            }
            else {
              lVar9 = std::__cxx11::string::find((char *)local_38,0x11c51b);
              if (lVar9 == 0) {
                std::__cxx11::string::substr((ulong)local_c8,(ulong)local_38);
                bVar6 = ConvertStringToDouble
                                  ((string *)
                                   CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffefa,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffef9,
                                                  in_stack_fffffffffffffef8))))))),
                                   (double *)
                                   CONCAT17(in_stack_fffffffffffffef7,
                                            CONCAT16(in_stack_fffffffffffffef6,
                                                     in_stack_fffffffffffffef0)));
                bVar7 = bVar6 && 0.0 < local_a8;
                std::__cxx11::string::~string(local_c8);
                if ((bVar7 & 1) != 0) {
                  dVar10 = log(local_a8);
                  *local_18 = dVar10;
                  local_1 = 1;
                  goto LAB_00106f13;
                }
              }
              else {
                lVar9 = std::__cxx11::string::find((char *)local_38,0x11c51e);
                if (lVar9 == 0) {
                  std::__cxx11::string::substr((ulong)local_f0,(ulong)local_38);
                  bVar7 = ConvertStringToDouble
                                    ((string *)
                                     CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffefa,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffef9,
                                                  in_stack_fffffffffffffef8))))))),
                                     (double *)
                                     CONCAT17(in_stack_fffffffffffffef7,
                                              CONCAT16(in_stack_fffffffffffffef6,
                                                       in_stack_fffffffffffffef0)));
                  std::__cxx11::string::~string(local_f0);
                  if ((bVar7 & 1) != 0) {
                    dVar10 = exp(local_d0);
                    *local_18 = dVar10;
                    local_1 = 1;
                    goto LAB_00106f13;
                  }
                }
              }
            }
            local_1 = 0;
          }
        }
      }
    }
  }
LAB_00106f13:
  local_74 = 1;
  std::__cxx11::string::~string(local_38);
LAB_00106f20:
  return (bool)(local_1 & 1);
}

Assistant:

bool ConvertSpecialStringToDouble(const std::string& input, double* output) {
  if (input.empty() || NULL == output) {
    return false;
  }

  std::string lowercase_input(input);
  std::transform(input.begin(), input.end(), lowercase_input.begin(),
                 [](unsigned char c) {
                   return static_cast<unsigned char>(std::tolower(c));
                 });
  if ("pi" == lowercase_input) {
    *output = sptk::kPi;
    return true;
  } else if ("db" == lowercase_input) {
    *output = sptk::kNeper;
    return true;
  } else if ("cent" == lowercase_input) {
    *output = 1200.0 * sptk::kOctave;
    return true;
  } else if ("semitone" == lowercase_input) {
    *output = 12.0 * sptk::kOctave;
    return true;
  } else if ("octave" == lowercase_input) {
    *output = sptk::kOctave;
    return true;
  } else if (lowercase_input.find("sqrt") == 0) {
    double tmp;
    if (ConvertStringToDouble(lowercase_input.substr(4), &tmp) && 0.0 <= tmp) {
      *output = std::sqrt(tmp);
      return true;
    }
  } else if (lowercase_input.find("ln") == 0) {
    double tmp;
    if (ConvertStringToDouble(lowercase_input.substr(2), &tmp) && 0.0 < tmp) {
      *output = std::log(tmp);
      return true;
    }
  } else if (lowercase_input.find("exp") == 0) {
    double tmp;
    if (ConvertStringToDouble(lowercase_input.substr(3), &tmp)) {
      *output = std::exp(tmp);
      return true;
    }
  }

  return false;
}